

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall
QPDFArgParser::QPDFArgParser(QPDFArgParser *this,int argc,char **argv,char *progname_env)

{
  Members *this_00;
  allocator<char> local_c9;
  string local_c8;
  bare_arg_handler_t local_a8;
  bare_arg_handler_t local_88;
  param_arg_handler_t local_68;
  param_arg_handler_t local_48;
  
  this_00 = (Members *)operator_new(0x290);
  Members::Members(this_00,argc,argv,progname_env);
  std::__shared_ptr<QPDFArgParser::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFArgParser::Members,void>
            ((__shared_ptr<QPDFArgParser::Members,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  selectHelpOptionTable(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"help",&local_c9);
  bindParam<QPDFArgParser>(&local_48,(QPDFArgParser *)argHelp,0,this);
  addChoices(this,&local_c8,&local_48,false,&PTR_anon_var_dwarf_1eed84_002b0210);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"help",&local_c9);
  bindParam<QPDFArgParser>(&local_68,(QPDFArgParser *)invalidHelpArg,0,this);
  addInvalidChoiceHandler(this,&local_c8,&local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"completion-bash",&local_c9);
  bindBare<QPDFArgParser>(&local_88,(QPDFArgParser *)argCompletionBash,0,this);
  addBare(this,&local_c8,&local_88);
  std::_Function_base::~_Function_base(&local_88.super__Function_base);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"completion-zsh",&local_c9)
  ;
  bindBare<QPDFArgParser>(&local_a8,(QPDFArgParser *)argCompletionZsh,0,this);
  addBare(this,&local_c8,&local_a8);
  std::_Function_base::~_Function_base(&local_a8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_c8);
  selectMainOptionTable(this);
  return;
}

Assistant:

QPDFArgParser::QPDFArgParser(int argc, char const* const argv[], char const* progname_env) :
    m(new Members(argc, argv, progname_env))
{
    selectHelpOptionTable();
    char const* help_choices[] = {"all", nullptr};
    // More help choices are added dynamically.
    addChoices("help", bindParam(&QPDFArgParser::argHelp, this), false, help_choices);
    addInvalidChoiceHandler("help", bindParam(&QPDFArgParser::invalidHelpArg, this));
    addBare("completion-bash", bindBare(&QPDFArgParser::argCompletionBash, this));
    addBare("completion-zsh", bindBare(&QPDFArgParser::argCompletionZsh, this));
    selectMainOptionTable();
}